

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

size_t bita_ffirst(uint8_t *b,size_t tot,size_t bits)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t r;
  uint64_t w;
  size_t bits_local;
  size_t tot_local;
  uint8_t *b_local;
  
  if (bits < tot) {
    iVar1 = 0;
    for (uVar2 = *(ulong *)b; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
      iVar1 = iVar1 + 1;
    }
    uVar3 = iVar1 + 1;
    if (*(ulong *)b == 0) {
      uVar3 = 0;
    }
    if (uVar3 == 0) {
      b_local = (uint8_t *)bita_ffirst(b + 8,tot,bits + 0x40);
    }
    else {
      b_local = (uint8_t *)(bits + uVar3 + -1);
    }
  }
  else {
    b_local = (uint8_t *)0xffffffffffffffff;
  }
  return (size_t)b_local;
}

Assistant:

static size_t bita_ffirst(const uint8_t *b, const size_t tot, size_t bits)
{
    if (bits >= tot)
        return SIZE_MAX;

    uint64_t w = *((uint64_t *) b);
    /* __builtin_ffsll returns one plus the index of the least significant 1-bit, or zero if not found */
    uint32_t r = __builtin_ffsll(w);
    if (r)
        return bits + r - 1; /* adjust result */

    return bita_ffirst(&b[8], tot, bits + 64);
}